

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Node * PruneSection(TidyDocImpl *doc,Node *node)

{
  Lexer *lexer_00;
  int iVar1;
  Node *pNVar2;
  Node *nbsp;
  Node *cell;
  ctmbstr lexbuf;
  Lexer *lexer;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  lexer = (Lexer *)node;
  while( true ) {
    iVar1 = prvTidytmbstrncmp(lexer_00->lexbuf + *(uint *)&lexer->itoken,"if !supportEmptyParas",
                              0x15);
    if ((iVar1 == 0) && (pNVar2 = FindEnclosingCell(doc,(Node *)lexer), pNVar2 != (Node *)0x0)) {
      pNVar2 = prvTidyNewLiteralTextNode(lexer_00,anon_var_dwarf_25a35);
      prvTidyInsertNodeBeforeElement((Node *)lexer,pNVar2);
    }
    if (*(int *)&lexer->root == 4) {
      lexer = *(Lexer **)&lexer->insertspace;
    }
    else {
      lexer = (Lexer *)prvTidyDiscardElement(doc,(Node *)lexer);
    }
    if (lexer == (Lexer *)0x0) break;
    if (*(int *)&lexer->root == 9) {
      iVar1 = prvTidytmbstrncmp(lexer_00->lexbuf + *(uint *)&lexer->itoken,"if",2);
      if (iVar1 == 0) {
        lexer = (Lexer *)PruneSection(doc,(Node *)lexer);
      }
      else {
        iVar1 = prvTidytmbstrncmp(lexer_00->lexbuf + *(uint *)&lexer->itoken,"endif",5);
        if (iVar1 == 0) {
          pNVar2 = prvTidyDiscardElement(doc,(Node *)lexer);
          return pNVar2;
        }
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

static Node* PruneSection( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;

    for (;;)
    {
        ctmbstr lexbuf = lexer->lexbuf + node->start;
        if ( TY_(tmbstrncmp)(lexbuf, "if !supportEmptyParas", 21) == 0 )
        {
          Node* cell = FindEnclosingCell( doc, node );
          if ( cell )
          {
            /* Need to put &nbsp; into cell so it doesn't look weird
            */
            Node* nbsp = TY_(NewLiteralTextNode)( lexer, "\240" );
            assert( (byte)'\240' == (byte)160 );
            TY_(InsertNodeBeforeElement)( node, nbsp );
          }
        }

        /* discard node and returns next, unless it is a text node */
        if ( node->type == TextNode )
            node = node->next;
        else
            node = TY_(DiscardElement)( doc, node );

        if (node == NULL)
            return NULL;
        
        if (node->type == SectionTag)
        {
            if (TY_(tmbstrncmp)(lexer->lexbuf + node->start, "if", 2) == 0)
            {
                node = PruneSection( doc, node );
                continue;
            }

            if (TY_(tmbstrncmp)(lexer->lexbuf + node->start, "endif", 5) == 0)
            {
                node = TY_(DiscardElement)( doc, node );
                break;
            }
        }
    }

    return node;
}